

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O0

int ConvolutionReverb::CreateCallback(UnityAudioEffectState *state)

{
  EffectData *data_00;
  Mutex *this;
  EffectData *data;
  UnityAudioEffectState *state_local;
  
  data_00 = (EffectData *)operator_new(0x90);
  data_00->tmpoutput = (UnityComplexNumber *)0x0;
  data_00->channels = (Channel *)0x0;
  data_00->lastparams[8] = 0.0;
  data_00->lastparams[9] = 0.0;
  *(undefined8 *)(data_00->lastparams + 10) = 0;
  data_00->lastparams[4] = 0.0;
  data_00->lastparams[5] = 0.0;
  data_00->lastparams[6] = 0.0;
  data_00->lastparams[7] = 0.0;
  data_00->lastparams[0] = 0.0;
  data_00->lastparams[1] = 0.0;
  data_00->lastparams[2] = 0.0;
  data_00->lastparams[3] = 0.0;
  data_00->hopsize = 0;
  data_00->bufferindex = 0;
  data_00->writeoffset = 0;
  data_00->samplerate = 0;
  *(undefined8 *)(data_00->p + 10) = 0;
  data_00->numpartitions = 0;
  data_00->fftsize = 0;
  data_00->p[6] = 0.0;
  data_00->p[7] = 0.0;
  data_00->p[8] = 0.0;
  data_00->p[9] = 0.0;
  data_00->p[2] = 0.0;
  data_00->p[3] = 0.0;
  data_00->p[4] = 0.0;
  data_00->p[5] = 0.0;
  data_00->mutex = (Mutex *)0x0;
  data_00->p[0] = 0.0;
  data_00->p[1] = 0.0;
  this = (Mutex *)operator_new(0x28);
  Mutex::Mutex(this);
  data_00->mutex = this;
  (state->field_0).field_0.effectdata = data_00;
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,data_00->p);
  SetupImpulse(data_00,2,0x400,(state->field_0).field_0.samplerate);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* data = new EffectData;
        memset(data, 0, sizeof(EffectData));
        data->mutex = new Mutex();
        state->effectdata = data;
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, data->p);
        SetupImpulse(data, 2, 1024, state->samplerate); // Assuming stereo and 1024 sample block size
        return UNITY_AUDIODSP_OK;
    }